

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O0

void duckdb::ApproxTopKUpdate<duckdb::string_t,duckdb::HistogramGenericFunctor>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  UnifiedVectorFormat *pUVar1;
  ulong in_RCX;
  idx_t in_RDI;
  UnifiedVectorFormat *in_R8;
  idx_t unaff_retaddr;
  Vector *in_stack_00000008;
  AggregateInputData *in_stack_00000010;
  string_t *in_stack_00000018;
  ApproxTopKState *state;
  idx_t idx;
  idx_t i;
  string_t *data;
  ApproxTopKState **states;
  UnifiedVectorFormat input_data;
  Vector extra_state;
  Vector *top_k_vector;
  UnifiedVectorFormat sdata;
  Vector *input;
  UnifiedVectorFormat *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  idx_t in_stack_fffffffffffffe98;
  Vector *in_stack_fffffffffffffea0;
  UnifiedVectorFormat *local_158;
  idx_t in_stack_fffffffffffffeb8;
  UnifiedVectorFormat *pUVar2;
  SelectionVector *local_140 [22];
  long local_90;
  SelectionVector *local_78 [10];
  UnifiedVectorFormat *local_28;
  ulong local_20;
  
  pUVar1 = (UnifiedVectorFormat *)local_78;
  local_28 = in_R8;
  local_20 = in_RCX;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(pUVar1);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  local_90 = in_RDI + 0x68;
  HistogramGenericFunctor::CreateExtraState(in_stack_fffffffffffffeb8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_140);
  HistogramGenericFunctor::PrepareData
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(Vector *)pUVar1,
             (UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  pUVar1 = (UnifiedVectorFormat *)
           UnifiedVectorFormat::GetData<duckdb::ApproxTopKState*>((UnifiedVectorFormat *)local_78);
  UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)local_140);
  for (local_158 = (UnifiedVectorFormat *)0x0; local_158 < local_28; local_158 = local_158 + 1) {
    SelectionVector::get_index(local_140[0],(idx_t)local_158);
    in_stack_fffffffffffffe8f =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   ((TemplatedValidityMask<unsigned_long> *)
                    CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                    (idx_t)in_stack_fffffffffffffe80);
    if ((bool)in_stack_fffffffffffffe8f) {
      pUVar2 = pUVar1;
      SelectionVector::get_index(local_78[0],(idx_t)local_158);
      ApproxTopKOperation::Operation<duckdb::string_t,duckdb::ApproxTopKState>
                (state,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
      in_stack_fffffffffffffe80 = pUVar1;
      pUVar1 = pUVar2;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe80);
  Vector::~Vector((Vector *)in_stack_fffffffffffffe80);
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe80);
  return;
}

Assistant:

static void ApproxTopKUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {
	using STATE = ApproxTopKState;
	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto &top_k_vector = inputs[1];

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
	auto data = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		ApproxTopKOperation::Operation<T, STATE>(state, data[idx], aggr_input, top_k_vector, i, count);
	}
}